

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O2

FT_Error afm_parser_parse(AFM_Parser parser)

{
  FT_Memory memory;
  AFM_FontInfo pAVar1;
  AFM_FontInfo pAVar2;
  int iVar3;
  AFM_Token AVar4;
  FT_Error FVar5;
  FT_Int FVar6;
  char *pcVar7;
  AFM_KernPair pAVar8;
  ulong uVar9;
  AFM_TrackKern pAVar10;
  long lVar11;
  uint uVar12;
  FT_Offset *in_RDX;
  FT_Offset *extraout_RDX;
  FT_Offset *extraout_RDX_00;
  FT_Offset *extraout_RDX_01;
  FT_Offset *extraout_RDX_02;
  FT_Offset *extraout_RDX_03;
  FT_Offset *extraout_RDX_04;
  FT_Offset *extraout_RDX_05;
  FT_Offset *extraout_RDX_06;
  FT_Offset *extraout_RDX_07;
  FT_Offset *extraout_RDX_08;
  FT_Offset *extraout_RDX_09;
  FT_Offset *extraout_RDX_10;
  FT_Offset *extraout_RDX_11;
  FT_Offset *extraout_RDX_12;
  FT_Offset *pFVar13;
  FT_Offset *extraout_RDX_13;
  FT_Offset *extraout_RDX_14;
  FT_Offset *extraout_RDX_15;
  FT_Offset *extraout_RDX_16;
  FT_Offset *extraout_RDX_17;
  undefined4 uVar14;
  undefined1 local_f8 [8];
  AFM_ValueRec shared_vals [4];
  FT_Offset len_1;
  FT_UInt local_a0;
  undefined4 uStack_9c;
  uint local_90;
  undefined4 uStack_8c;
  uint local_80;
  undefined4 uStack_7c;
  FT_Fixed local_70;
  FT_Offset local_60;
  FT_Offset len;
  uint local_4c;
  FT_Int FStack_48;
  FT_Int metrics_sets;
  FT_Int n;
  uint local_3c;
  int iStack_38;
  FT_Int tmp;
  
  memory = parser->memory;
  pAVar1 = parser->FontInfo;
  local_4c = 0;
  if (pAVar1 == (AFM_FontInfo)0x0) {
    return 6;
  }
  pcVar7 = afm_parser_next_key(parser,(FT_Bool)&local_60,in_RDX);
  if (pcVar7 == (char *)0x0) {
    return 2;
  }
  if (local_60 != 0x10) {
    return 2;
  }
  iVar3 = strncmp(pcVar7,"StartFontMetrics",0x10);
  if (iVar3 != 0) {
    return 2;
  }
  uVar14 = 0xa0;
  pFVar13 = extraout_RDX;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              pcVar7 = afm_parser_next_key(parser,(FT_Bool)&local_60,pFVar13);
              if (pcVar7 == (char *)0x0) goto LAB_00206a25;
              AVar4 = afm_tokenize(pcVar7,local_60);
              if (AVar4 != AFM_TOKEN_ASCENDER) break;
              local_f8._0_4_ = AFM_VALUE_TYPE_FIXED;
              FVar6 = afm_parser_read_vals(parser,(AFM_Value)local_f8,1);
              if (FVar6 != 1) goto LAB_00206a25;
              pAVar1->Ascender = CONCAT71(shared_vals[0]._1_7_,(undefined1)shared_vals[0].type);
              pFVar13 = extraout_RDX_06;
            }
            if (AVar4 != AFM_TOKEN_DESCENDER) break;
            local_f8._0_4_ = AFM_VALUE_TYPE_FIXED;
            FVar6 = afm_parser_read_vals(parser,(AFM_Value)local_f8,1);
            if (FVar6 != 1) goto LAB_00206a25;
            pAVar1->Descender = CONCAT71(shared_vals[0]._1_7_,(undefined1)shared_vals[0].type);
            pFVar13 = extraout_RDX_02;
          }
          if (AVar4 != AFM_TOKEN_FONTBBOX) break;
          local_f8._0_4_ = AFM_VALUE_TYPE_FIXED;
          shared_vals[0].u._0_4_ = local_f8._0_4_;
          shared_vals[1].u._0_4_ = local_f8._0_4_;
          shared_vals[2].u._0_4_ = local_f8._0_4_;
          FVar6 = afm_parser_read_vals(parser,(AFM_Value)local_f8,4);
          if (FVar6 != 4) goto LAB_00206a25;
          (pAVar1->FontBBox).xMin = CONCAT71(shared_vals[0]._1_7_,(undefined1)shared_vals[0].type);
          (pAVar1->FontBBox).yMin = shared_vals[1]._0_8_;
          (pAVar1->FontBBox).xMax = shared_vals[2]._0_8_;
          (pAVar1->FontBBox).yMax = shared_vals[3]._0_8_;
          pFVar13 = extraout_RDX_08;
        }
        if (AVar4 != AFM_TOKEN_ISCIDFONT) break;
        local_f8._0_4_ = AFM_VALUE_TYPE_BOOL;
        FVar6 = afm_parser_read_vals(parser,(AFM_Value)local_f8,1);
        if (FVar6 != 1) goto LAB_00206a25;
        pAVar1->IsCIDFont = (undefined1)shared_vals[0].type;
        pFVar13 = extraout_RDX_01;
      }
      if (AVar4 == AFM_TOKEN_METRICSSETS) break;
      if (AVar4 == AFM_TOKEN_STARTCHARMETRICS) {
        FStack_48 = 0;
        FVar5 = afm_parser_read_int(parser,&FStack_48);
        if (FVar5 != 0) goto LAB_00206a25;
        iVar3 = FStack_48 + 1;
        pFVar13 = extraout_RDX_03;
        while (iVar3 = iVar3 + -1, 0 < iVar3) {
          pcVar7 = afm_parser_next_key(parser,'\0',pFVar13);
          pFVar13 = extraout_RDX_04;
          if (pcVar7 == (char *)0x0) {
            return 0xa0;
          }
        }
        do {
          pcVar7 = afm_parser_next_key(parser,(char)shared_vals + '8',pFVar13);
          if (pcVar7 == (char *)0x0) {
            return 0xa0;
          }
          AVar4 = afm_tokenize(pcVar7,CONCAT44(shared_vals[3].u.f._4_4_,shared_vals[3].u.i));
        } while ((AVar4 != AFM_TOKEN_ENDCHARMETRICS) &&
                (pFVar13 = extraout_RDX_05, AVar4 != AFM_TOKEN_ENDFONTMETRICS));
        uVar14 = 0;
        pFVar13 = extraout_RDX_05;
      }
      else {
        if (AVar4 == AFM_TOKEN_ENDFONTMETRICS) {
          return 0;
        }
        pFVar13 = extraout_RDX_00;
        if (AVar4 == AFM_TOKEN_STARTKERNDATA) goto LAB_0020672b;
      }
    }
    FVar5 = afm_parser_read_int(parser,(FT_Int *)&local_4c);
    if (FVar5 != 0) goto LAB_00206a25;
    pFVar13 = extraout_RDX_07;
  } while ((local_4c & 0xfffffffd) == 0);
  uVar14 = 7;
  goto LAB_00206a25;
  while (pFVar13 = extraout_RDX_09, AVar4 == AFM_TOKEN_UNKNOWN) {
LAB_0020672b:
    pcVar7 = afm_parser_next_key(parser,(FT_Bool)&len,pFVar13);
    uVar14 = 0xa0;
    if (pcVar7 == (char *)0x0) goto LAB_00206a25;
    AVar4 = afm_tokenize(pcVar7,len);
    if (AVar4 - AFM_TOKEN_STARTKERNPAIRS < 2) {
      pAVar2 = parser->FontInfo;
      FVar5 = afm_parser_read_int(parser,(FT_Int *)&local_3c);
      if (FVar5 != 0) goto LAB_00206a25;
      if ((int)local_3c < 0) goto LAB_00206a25;
      pAVar2->NumKernPair = local_3c;
      pFVar13 = extraout_RDX_10;
      if (local_3c != 0) {
        pAVar8 = (AFM_KernPair)
                 ft_mem_realloc(parser->memory,0x10,0,(ulong)local_3c,(void *)0x0,
                                (FT_Error *)&shared_vals[3].u.f);
        pAVar2->KernPairs = pAVar8;
        pFVar13 = extraout_RDX_11;
        uVar14 = shared_vals[3].u.i;
        if (shared_vals[3].u.i != 0) goto LAB_00206a25;
      }
      _iStack_38 = 0xffffffffffffffff;
      while( true ) {
        do {
          pcVar7 = afm_parser_next_key(parser,(FT_Bool)&FStack_48,pFVar13);
          if (pcVar7 == (char *)0x0) goto LAB_00206a1f;
          AVar4 = afm_tokenize(pcVar7,CONCAT44(metrics_sets,FStack_48));
          uVar9 = (ulong)(AVar4 - AFM_TOKEN_ENDFONTMETRICS);
          if (0x37 < AVar4 - AFM_TOKEN_ENDFONTMETRICS) goto LAB_00206a1f;
          pFVar13 = extraout_RDX_12;
        } while (uVar9 == 0x37);
        if ((7UL >> (uVar9 & 0x3f) & 1) != 0) break;
        if ((0x34000UL >> (uVar9 & 0x3f) & 1) == 0) goto LAB_00206a1f;
        uVar12 = (int)_iStack_38 + 1;
        if ((int)pAVar2->NumKernPair <= (int)uVar12) goto LAB_00206a1f;
        pAVar8 = pAVar2->KernPairs + (int)uVar12;
        shared_vals[3].u._0_4_ = 5;
        _iStack_38 = (ulong)uVar12;
        FVar6 = afm_parser_read_vals(parser,(AFM_Value)&shared_vals[3].u,4);
        if (FVar6 < 3) goto LAB_00206a1f;
        pAVar8->index1 = (FT_UInt)len_1;
        pAVar8->index2 = local_a0;
        pFVar13 = (FT_Offset *)0x0;
        uVar12 = local_90;
        if (AVar4 != AFM_TOKEN_KPY) {
          uVar12 = 0;
          if (FVar6 == 4 && AVar4 == AFM_TOKEN_KP) {
            uVar12 = local_80;
          }
          pFVar13 = (FT_Offset *)(ulong)local_90;
        }
        pAVar8->x = (FT_Int)pFVar13;
        pAVar8->y = uVar12;
      }
      uVar12 = (int)_iStack_38 + 1;
      pAVar2->NumKernPair = uVar12;
      qsort(pAVar2->KernPairs,(ulong)uVar12,0x10,afm_compare_kern_pairs);
      pFVar13 = extraout_RDX_13;
      goto LAB_0020672b;
    }
    if (AVar4 == AFM_TOKEN_STARTTRACKKERN) {
      pAVar2 = parser->FontInfo;
      FVar5 = afm_parser_read_int(parser,(FT_Int *)&local_3c);
      if (FVar5 != 0) goto LAB_00206a25;
      if ((int)local_3c < 0) goto LAB_00206a25;
      pAVar2->NumTrackKern = local_3c;
      pFVar13 = extraout_RDX_14;
      if (local_3c != 0) {
        pAVar10 = (AFM_TrackKern)
                  ft_mem_realloc(parser->memory,0x28,0,(ulong)local_3c,(void *)0x0,
                                 (FT_Error *)&shared_vals[3].u.f);
        pAVar2->TrackKerns = pAVar10;
        pFVar13 = extraout_RDX_15;
        uVar14 = shared_vals[3].u.i;
        if (shared_vals[3].u.i != 0) goto LAB_00206a25;
      }
      _iStack_38 = CONCAT44(tmp,0xffffffff);
      do {
        while( true ) {
          pcVar7 = afm_parser_next_key(parser,(FT_Bool)&FStack_48,pFVar13);
          if (pcVar7 == (char *)0x0) goto LAB_00206a1f;
          AVar4 = afm_tokenize(pcVar7,CONCAT44(metrics_sets,FStack_48));
          if (AVar4 != AFM_TOKEN_TRACKKERN) break;
          iVar3 = iStack_38 + 1;
          _iStack_38 = CONCAT44(tmp,iVar3);
          if ((int)pAVar2->NumTrackKern <= iVar3) goto LAB_00206a1f;
          pAVar10 = pAVar2->TrackKerns;
          shared_vals[3].u.i = 3;
          FVar6 = afm_parser_read_vals(parser,(AFM_Value)&shared_vals[3].u,5);
          if (FVar6 != 5) goto LAB_00206a1f;
          lVar11 = (long)iStack_38;
          pAVar10[lVar11].degree = (FT_UInt)len_1;
          pAVar10[lVar11].min_ptsize = CONCAT44(uStack_9c,local_a0);
          pAVar10[lVar11].min_kern = CONCAT44(uStack_8c,local_90);
          pAVar10[lVar11].max_ptsize = CONCAT44(uStack_7c,local_80);
          pAVar10[lVar11].max_kern = local_70;
          pFVar13 = extraout_RDX_17;
        }
        pFVar13 = extraout_RDX_16;
      } while (AVar4 == AFM_TOKEN_UNKNOWN);
      if ((1 < AVar4 - AFM_TOKEN_ENDFONTMETRICS) && (AVar4 != AFM_TOKEN_ENDTRACKKERN)) {
LAB_00206a1f:
        uVar14 = 0xa0;
        goto LAB_00206a25;
      }
      pAVar2->NumTrackKern = iStack_38 + 1;
      goto LAB_0020672b;
    }
  }
  if (AVar4 - AFM_TOKEN_ENDFONTMETRICS < 2) {
    return 0;
  }
LAB_00206a25:
  ft_mem_free(memory,pAVar1->TrackKerns);
  pAVar1->TrackKerns = (AFM_TrackKern)0x0;
  pAVar1->NumTrackKern = 0;
  ft_mem_free(memory,pAVar1->KernPairs);
  pAVar1->KernPairs = (AFM_KernPair)0x0;
  pAVar1->NumKernPair = 0;
  pAVar1->IsCIDFont = '\0';
  return uVar14;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  afm_parser_parse( AFM_Parser  parser )
  {
    FT_Memory     memory = parser->memory;
    AFM_FontInfo  fi     = parser->FontInfo;
    FT_Error      error  = FT_ERR( Syntax_Error );
    char*         key;
    FT_Offset     len;
    FT_Int        metrics_sets = 0;


    if ( !fi )
      return FT_THROW( Invalid_Argument );

    key = afm_parser_next_key( parser, 1, &len );
    if ( !key || len != 16                              ||
         ft_strncmp( key, "StartFontMetrics", 16 ) != 0 )
      return FT_THROW( Unknown_File_Format );

    while ( ( key = afm_parser_next_key( parser, 1, &len ) ) != 0 )
    {
      AFM_ValueRec  shared_vals[4];


      switch ( afm_tokenize( key, len ) )
      {
      case AFM_TOKEN_METRICSSETS:
        if ( afm_parser_read_int( parser, &metrics_sets ) )
          goto Fail;

        if ( metrics_sets != 0 && metrics_sets != 2 )
        {
          error = FT_THROW( Unimplemented_Feature );

          goto Fail;
        }
        break;

      case AFM_TOKEN_ISCIDFONT:
        shared_vals[0].type = AFM_VALUE_TYPE_BOOL;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->IsCIDFont = shared_vals[0].u.b;
        break;

      case AFM_TOKEN_FONTBBOX:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[1].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[2].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[3].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 4 ) != 4 )
          goto Fail;

        fi->FontBBox.xMin = shared_vals[0].u.f;
        fi->FontBBox.yMin = shared_vals[1].u.f;
        fi->FontBBox.xMax = shared_vals[2].u.f;
        fi->FontBBox.yMax = shared_vals[3].u.f;
        break;

      case AFM_TOKEN_ASCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Ascender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_DESCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Descender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_STARTCHARMETRICS:
        {
          FT_Int  n = 0;


          if ( afm_parser_read_int( parser, &n ) )
            goto Fail;

          error = afm_parser_skip_section( parser, n,
                                           AFM_TOKEN_ENDCHARMETRICS );
          if ( error )
            return error;
        }
        break;

      case AFM_TOKEN_STARTKERNDATA:
        error = afm_parse_kern_data( parser );
        if ( error )
          goto Fail;
        /* fall through since we only support kern data */

      case AFM_TOKEN_ENDFONTMETRICS:
        return FT_Err_Ok;

      default:
        break;
      }
    }

  Fail:
    FT_FREE( fi->TrackKerns );
    fi->NumTrackKern = 0;

    FT_FREE( fi->KernPairs );
    fi->NumKernPair = 0;

    fi->IsCIDFont = 0;

    return error;
  }